

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

file_info * rede_get_entry(file_info *re)

{
  file_info *pfVar1;
  file_info *file;
  file_info *re_local;
  
  pfVar1 = (re->rede_files).first;
  if ((pfVar1 != (file_info *)0x0) &&
     ((re->rede_files).first = pfVar1->re_next, (re->rede_files).first == (file_info *)0x0)) {
    (re->rede_files).last = &(re->rede_files).first;
  }
  return pfVar1;
}

Assistant:

static inline struct file_info *
rede_get_entry(struct file_info *re)
{
	struct file_info *file;

	if ((file = re->rede_files.first) != NULL) {
		re->rede_files.first = file->re_next;
		if (re->rede_files.first == NULL)
			re->rede_files.last =
			    &(re->rede_files.first);
	}
	return (file);
}